

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall google::protobuf::Message::SetCachedSize(Message *this,int size)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  LogFinisher local_49;
  LogMessage local_48;
  
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
             ,0x99);
  pLVar2 = internal::LogMessage::operator<<(&local_48,"Message class \"");
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x13])(this);
  pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)(CONCAT44(extraout_var,iVar1) + 8));
  pLVar2 = internal::LogMessage::operator<<
                     (pLVar2,
                      "\" implements neither SetCachedSize() nor ByteSize().  Must implement one or the other."
                     );
  internal::LogFinisher::operator=(&local_49,pLVar2);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void Message::SetCachedSize(int size) const {
  GOOGLE_LOG(FATAL) << "Message class \"" << GetDescriptor()->full_name()
             << "\" implements neither SetCachedSize() nor ByteSize().  "
                "Must implement one or the other.";
}